

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TestCaseInfo *other;
  IStreamingReporter *pIVar4;
  TestCaseTracker *this_00;
  IContext *pIVar5;
  byte local_3d2;
  byte local_3c2;
  TestCaseStats local_3a8;
  TestCaseTracker local_218;
  undefined1 local_198 [8];
  TestCaseInfo testInfo;
  string redirectedCerr;
  string local_68 [8];
  string redirectedCout;
  undefined1 auStack_48 [8];
  Totals prevTotals;
  TestCase *testCase_local;
  RunContext *this_local;
  
  auStack_48 = (undefined1  [8])(this->m_totals).assertions.passed;
  prevTotals.assertions.passed = (this->m_totals).assertions.failed;
  prevTotals.assertions.failed = (this->m_totals).assertions.failedButOk;
  prevTotals.assertions.failedButOk = (this->m_totals).testCases.passed;
  prevTotals.testCases.passed = (this->m_totals).testCases.failed;
  prevTotals.testCases.failed = (this->m_totals).testCases.failedButOk;
  prevTotals.testCases.failedButOk = (size_t)testCase;
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string((string *)&testInfo.properties);
  other = TestCase::getTestCaseInfo((TestCase *)prevTotals.testCases.failedButOk);
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)local_198,other);
  pIVar4 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar4,local_198);
  this->m_activeTestCase = (TestCase *)prevTotals.testCases.failedButOk;
  SectionTracking::TestCaseTracker::TestCaseTracker(&local_218,(string *)local_198);
  Option<Catch::SectionTracking::TestCaseTracker>::operator=(&this->m_testCaseTracker,&local_218);
  SectionTracking::TestCaseTracker::~TestCaseTracker(&local_218);
  do {
    do {
      runCurrentTest(this,(string *)local_68,(string *)&testInfo.properties);
      this_00 = Option<Catch::SectionTracking::TestCaseTracker>::operator->
                          (&this->m_testCaseTracker);
      bVar1 = SectionTracking::TestCaseTracker::isCompleted(this_00);
      local_3c2 = 0;
      if (!bVar1) {
        iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[9])();
        local_3c2 = (byte)iVar2 ^ 0xff;
      }
    } while ((local_3c2 & 1) != 0);
    pIVar5 = getCurrentContext();
    uVar3 = (*pIVar5->_vptr_IContext[5])();
    local_3d2 = 0;
    if ((uVar3 & 1) != 0) {
      iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[9])();
      local_3d2 = (byte)iVar2 ^ 0xff;
    }
  } while ((local_3d2 & 1) != 0);
  Totals::delta(__return_storage_ptr__,&this->m_totals,(Totals *)auStack_48);
  Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
  pIVar4 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[9])();
  TestCaseStats::TestCaseStats
            (&local_3a8,(TestCaseInfo *)local_198,__return_storage_ptr__,(string *)local_68,
             (string *)&testInfo.properties,(bool)((byte)iVar2 & 1));
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar4,&local_3a8);
  TestCaseStats::~TestCaseStats(&local_3a8);
  this->m_activeTestCase = (TestCase *)0x0;
  Option<Catch::SectionTracking::TestCaseTracker>::reset(&this->m_testCaseTracker);
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_198);
  std::__cxx11::string::~string((string *)&testInfo.properties);
  std::__cxx11::string::~string(local_68);
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;
            m_testCaseTracker = TestCaseTracker( testInfo.name );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isCompleted() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = NULL;
            m_testCaseTracker.reset();

            return deltaTotals;
        }